

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::detail::MessageBuilder::~MessageBuilder(MessageBuilder *this)

{
  long in_RDI;
  String *in_stack_fffffffffffffff0;
  
  if ((*(byte *)(in_RDI + 0x30) & 1) == 0) {
    tlssPop();
    String::~String(in_stack_fffffffffffffff0);
  }
  MessageData::~MessageData((MessageData *)0x10c9e7);
  return;
}

Assistant:

MessageBuilder::~MessageBuilder() {
        if (!logged)
            tlssPop();
    }